

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O1

double __thiscall CDT::predict(CDT *this,vector<double,_std::allocator<double>_> *inputs)

{
  pointer pdVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  if ((inputs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish ==
      (inputs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    uVar2 = 0;
    do {
      dVar4 = Matrix<double>::get(&((this->m_layers).
                                    super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                                    super__Vector_impl_data._M_start)->m_weights,0,(uint)uVar2);
      pdVar1 = (inputs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar3 = dVar3 + dVar4 * pdVar1[uVar2];
      uVar2 = (ulong)((uint)uVar2 + 1);
    } while (uVar2 < (ulong)((long)(inputs->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  dVar3 = Activation::run(&this->m_function,dVar3);
  return dVar3;
}

Assistant:

double CDT::predict(const std::vector<double>& inputs) const{
    // std::cout<<"Prediction for (";
    // for(unsigned i=0;i<inputs.size();++i){
    //     std::cout<<inputs[i]<<" ";
    // }
    // std::cout<<"): ";

    return feed_forward(inputs);
}